

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_portable.cc
# Opt level: O2

uint32_t crc32c::ExtendPortable(uint32_t crc,uint8_t *data,size_t size)

{
  uint *puVar1;
  long lVar2;
  uint *puVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  
  puVar3 = (uint *)(data + size);
  uVar10 = (ulong)~crc;
  puVar1 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
  puVar11 = (uint *)data;
  if (puVar1 <= puVar3) {
    for (; data = (uint8_t *)puVar1, puVar11 != puVar1; puVar11 = (uint *)((long)puVar11 + 1)) {
      uVar10 = (ulong)((uint)(uVar10 >> 8) ^
                      *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                               (ulong)((uint)(byte)*puVar11 ^ (uint)uVar10 & 0xff) * 4));
    }
  }
  if (0xf < (long)puVar3 - (long)data) {
    uVar7 = (uint)uVar10 ^ *(uint *)data;
    uVar8 = *(uint *)((long)data + 4);
    uVar12 = *(uint *)((long)data + 8);
    uVar13 = *(uint *)((long)data + 0xc);
    lVar2 = -0x10 - (long)data;
    data = (uint8_t *)((long)data + 0x10);
    for (pbVar4 = (byte *)((long)puVar3 + lVar2); 0x100 < (long)pbVar4; pbVar4 = pbVar4 + -0x40) {
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ *(uint *)data ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4)
              ^ *(uint *)((long)data + 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar8 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar8 >> 0x18) * 4
                       );
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ *(uint *)((long)data + 8) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar15 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar13 & 0xff) * 4) ^ *(uint *)((long)data + 0xc) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x10) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4
                        ) ^ *(uint *)((long)data + 0x14) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar8 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                        (ulong)(uVar8 >> 0x18) * 4);
      uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar12 & 0xff) * 4
                       ) ^ *(uint *)((long)data + 0x18) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar12 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                       (ulong)(uVar12 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar15 & 0xff) * 4) ^ *(uint *)((long)data + 0x1c) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar15 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar15 >> 0x18) * 4);
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x20) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar14 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar13 & 0xff) * 4) ^ *(uint *)((long)data + 0x24) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
      uVar15 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4
                        ) ^ *(uint *)((long)data + 0x28) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar8 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                        (ulong)(uVar8 >> 0x18) * 4);
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ *(uint *)((long)data + 0x2c) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x30) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar14 & 0xff) * 4
                       ) ^ *(uint *)((long)data + 0x34) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar14 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar14 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                       (ulong)(uVar14 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar15 & 0xff) * 4) ^ *(uint *)((long)data + 0x38) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar15 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar15 >> 0x18) * 4);
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar13 & 0xff) * 4) ^ *(uint *)((long)data + 0x3c) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
      data = (uint8_t *)((long)data + 0x40);
    }
    for (; 0xf < (long)pbVar4; pbVar4 = pbVar4 + -0x10) {
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ *(uint *)data ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4)
              ^ *(uint *)((long)data + 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar8 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar8 >> 0x18) * 4
                       );
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ *(uint *)((long)data + 8) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar13 & 0xff) * 4) ^ *(uint *)((long)data + 0xc) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
      data = (uint8_t *)((long)data + 0x10);
    }
    for (; 3 < (long)pbVar4; pbVar4 = pbVar4 + -4) {
      uVar14 = uVar7 & 0xff;
      uVar15 = *(uint *)data;
      uVar5 = uVar7 >> 8;
      uVar6 = uVar7 >> 0xe;
      uVar9 = uVar7 >> 0x18;
      data = (uint8_t *)((long)data + 4);
      uVar7 = uVar8;
      uVar8 = uVar12;
      uVar12 = uVar13;
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)uVar14 * 4) ^
               uVar15 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                                 (ulong)(uVar5 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar6 & 0x3fc)) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar9 * 4);
    }
    lVar2 = 4;
    while (bVar16 = lVar2 != 0, lVar2 = lVar2 + -1, bVar16) {
      uVar7 = uVar7 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (ulong)(uVar7 & 0xff) * 4);
    }
    uVar7 = uVar7 ^ uVar8;
    lVar2 = 4;
    while (bVar16 = lVar2 != 0, lVar2 = lVar2 + -1, bVar16) {
      uVar7 = uVar7 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (ulong)(uVar7 & 0xff) * 4);
    }
    uVar7 = uVar7 ^ uVar12;
    lVar2 = 4;
    while (bVar16 = lVar2 != 0, lVar2 = lVar2 + -1, bVar16) {
      uVar7 = uVar7 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (ulong)(uVar7 & 0xff) * 4);
    }
    uVar7 = uVar7 ^ uVar13;
    lVar2 = 4;
    while( true ) {
      uVar10 = (ulong)uVar7;
      bVar16 = lVar2 == 0;
      lVar2 = lVar2 + -1;
      if (bVar16) break;
      uVar7 = uVar7 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (uVar10 & 0xff) * 4);
    }
  }
  for (; uVar8 = (uint)uVar10, (uint *)data != puVar3; data = (uint8_t *)((long)data + 1)) {
    uVar10 = (ulong)(uVar8 >> 8 ^
                    *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                             (ulong)((uint)(byte)*(uint *)data ^ uVar8 & 0xff) * 4));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return ~uVar8;
}

Assistant:

uint32_t ExtendPortable(uint32_t crc, const uint8_t* data, size_t size) {
  const uint8_t* p = data;
  const uint8_t* e = p + size;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    while ((e - p) > kPrefetchHorizon) {
      RequestPrefetch(p + kPrefetchHorizon);

      // Process 64 bytes at a time.
      STEP16;
      STEP16;
      STEP16;
      STEP16;
    }

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}